

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::HBDEstimateNoiseTest_DISABLED_Speed_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::HBDEstimateNoiseTest_DISABLED_Speed_Test>
           *this)

{
  HBDEstimateNoiseTest *this_00;
  
  WithParamInterface<std::tuple<double(*)(unsigned_short_const*,int,int,int,int,int),double(*)(unsigned_short_const*,int,int,int,int,int),int,int,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (HBDEstimateNoiseTest *)operator_new(0x48);
  anon_unknown.dwarf_8b0f81::HBDEstimateNoiseTest::HBDEstimateNoiseTest(this_00);
  (this_00->
  super_TestWithParam<std::tuple<double_(*)(const_unsigned_short_*,_int,_int,_int,_int,_int),_double_(*)(const_unsigned_short_*,_int,_int,_int,_int,_int),_int,_int,_int>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00f03700;
  (this_00->
  super_TestWithParam<std::tuple<double_(*)(const_unsigned_short_*,_int,_int,_int,_int,_int),_double_(*)(const_unsigned_short_*,_int,_int,_int,_int,_int),_int,_int,_int>_>
  ).
  super_WithParamInterface<std::tuple<double_(*)(const_unsigned_short_*,_int,_int,_int,_int,_int),_double_(*)(const_unsigned_short_*,_int,_int,_int,_int,_int),_int,_int,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__HBDEstimateNoiseTest_DISABLED_Speed_Test_00f03740;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }